

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

int __thiscall NavierStokesBase::steadyState(NavierStokesBase *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pSVar6;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> fabarray_;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var7;
  Real RVar8;
  pointer pGVar9;
  int *piVar10;
  long lVar11;
  ostream *poVar12;
  Print *pPVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  long lVar18;
  double *pdVar19;
  int i;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  int *piVar26;
  long lVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  long lVar31;
  int j;
  double *pdVar32;
  long lVar33;
  double *pdVar34;
  double *pdVar35;
  bool bVar36;
  double dVar37;
  gpu_tuple_element<0UL,_double> gVar38;
  double dVar39;
  double dVar40;
  ReduceOps<amrex::ReduceOpMax> reduce_op;
  gpu_tuple_element<0UL,_double> local_2b0;
  Box local_20c;
  ReduceData<double> reduce_data;
  MFIter mfi;
  
  pSVar6 = (this->super_AmrLevel).state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start;
  fabarray_.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
        &(pSVar6->old_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  if (fabarray_.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl ==
      (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
    uVar20 = 0;
  }
  else {
    _Var7.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (pSVar6->new_data)._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::ReduceData<double>::ReduceData<amrex::ReduceOpMax>(&reduce_data,&reduce_op);
    amrex::MFIter::MFIter
              (&mfi,(FabArrayBase *)
                    fabarray_.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,true);
    local_2b0.m_value = 0.0;
    while( true ) {
      piVar26 = &mfi.currentIndex;
      if (mfi.endIndex <= mfi.currentIndex) break;
      amrex::MFIter::tilebox(&local_20c,&mfi);
      pGVar9 = reduce_data.m_tuple.
               super_vector<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>.
               super__Vector_base<amrex::GpuTuple<double>,_std::allocator<amrex::GpuTuple<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar10 = piVar26;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar10 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      lVar16 = *(long *)(*(long *)((long)&(((FabArrayBase *)
                                           ((long)fabarray_.
                                                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                                  .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                                  _M_head_impl + 0xf0))->boxarray).m_bat.m_op + 0xc)
                        + (long)*piVar10 * 8);
      iVar2 = *(int *)(lVar16 + 0x20);
      iVar3 = *(int *)(lVar16 + 0x2c);
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar26 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start + mfi.currentIndex;
      }
      lVar18 = *(long *)(*(long *)((long)_Var7.
                                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>.
                                         _M_head_impl + 0x108) + (long)*piVar26 * 8);
      iVar4 = *(int *)(lVar18 + 0x20);
      iVar5 = *(int *)(lVar18 + 0x2c);
      lVar14 = (long)((*(int *)(lVar18 + 0x28) - *(int *)(lVar18 + 0x1c)) + 1);
      lVar23 = (long)local_20c.smallend.vect[1];
      lVar31 = (long)local_20c.smallend.vect[2];
      lVar33 = lVar23 * 8;
      lVar21 = (long)((*(int *)(lVar18 + 0x24) - *(int *)(lVar18 + 0x18)) + 1);
      lVar15 = (long)local_20c.smallend.vect[0];
      pdVar32 = (double *)
                ((lVar33 + (lVar31 - iVar4) * lVar14 * 8 + (long)*(int *)(lVar18 + 0x1c) * -8) *
                 lVar21 + lVar15 * 8 + (long)*(int *)(lVar18 + 0x18) * -8 + *(long *)(lVar18 + 0x10)
                );
      lVar27 = (long)((*(int *)(lVar16 + 0x24) - *(int *)(lVar16 + 0x18)) + 1);
      lVar24 = (long)((*(int *)(lVar16 + 0x28) - *(int *)(lVar16 + 0x1c)) + 1);
      lVar25 = (long)local_20c.bigend.vect[0];
      lVar18 = (long)local_20c.bigend.vect[1];
      pdVar28 = (double *)
                (*(long *)(lVar16 + 0x10) +
                (lVar33 + (lVar31 - iVar2) * lVar24 * 8 + (long)*(int *)(lVar16 + 0x1c) * -8) *
                lVar27 + lVar15 * 8 + (long)*(int *)(lVar16 + 0x18) * -8);
      lVar16 = (long)local_20c.bigend.vect[2];
      lVar14 = lVar14 * lVar21;
      lVar24 = lVar24 * lVar27;
      for (; pdVar29 = pdVar28, lVar33 = lVar23, pdVar34 = pdVar32, lVar31 <= lVar16;
          lVar31 = lVar31 + 1) {
        for (; lVar22 = lVar15, pdVar30 = pdVar29, pdVar35 = pdVar34, lVar33 <= lVar18;
            lVar33 = lVar33 + 1) {
          for (; lVar22 <= lVar25; lVar22 = lVar22 + 1) {
            dVar39 = 0.0;
            dVar40 = 0.0;
            lVar11 = 3;
            pdVar17 = pdVar30;
            pdVar19 = pdVar35;
            while (bVar36 = lVar11 != 0, lVar11 = lVar11 + -1, bVar36) {
              dVar39 = dVar39 + *pdVar17 * *pdVar17;
              dVar40 = dVar40 + *pdVar19 * *pdVar19;
              pdVar19 = (double *)((long)pdVar19 + (long)((iVar5 - iVar4) + 1) * lVar14 * 8);
              pdVar17 = (double *)((long)pdVar17 + (long)((iVar3 - iVar2) + 1) * lVar24 * 8);
            }
            if (dVar39 < 0.0) {
              dVar39 = sqrt(dVar39);
            }
            else {
              dVar39 = SQRT(dVar39);
            }
            if (dVar40 < 0.0) {
              dVar40 = sqrt(dVar40);
            }
            else {
              dVar40 = SQRT(dVar40);
            }
            dVar1 = (pGVar9->super_gpu_tuple_impl<0UL,_double>).super_gpu_tuple_element<0UL,_double>
                    .m_value;
            dVar37 = ABS(dVar40 - dVar39);
            if (ABS(dVar40 - dVar39) <= dVar1) {
              dVar37 = dVar1;
            }
            (pGVar9->super_gpu_tuple_impl<0UL,_double>).super_gpu_tuple_element<0UL,_double>.m_value
                 = dVar37;
            pdVar35 = pdVar35 + 1;
            pdVar30 = pdVar30 + 1;
          }
          pdVar29 = pdVar29 + lVar27;
          pdVar34 = pdVar34 + lVar21;
        }
        pdVar32 = pdVar32 + lVar14;
        pdVar28 = pdVar28 + lVar24;
      }
      gVar38.m_value =
           (double)std::function<amrex::GpuTuple<double>_()>::operator()(&reduce_data.m_fn_value);
      if (local_2b0.m_value <= gVar38.m_value) {
        local_2b0.m_value = gVar38.m_value;
      }
      amrex::MFIter::operator++(&mfi);
    }
    amrex::MFIter::~MFIter(&mfi);
    RVar8 = steady_tol;
    if (verbose != 0) {
      poVar12 = amrex::OutStream();
      amrex::Print::Print((Print *)&mfi,poVar12);
      std::operator<<((ostream *)&mfi.tile_size,"steadyState :: \n");
      std::operator<<((ostream *)&mfi.tile_size,"LEV = ");
      pPVar13 = amrex::Print::operator<<((Print *)&mfi,&(this->super_AmrLevel).level);
      std::operator<<((ostream *)&pPVar13->ss," MAX_CHANGE = ");
      std::ostream::_M_insert<double>(local_2b0.m_value);
      std::endl<char,std::char_traits<char>>((ostream *)&pPVar13->ss);
      amrex::Print::~Print((Print *)&mfi);
      if (local_2b0.m_value < RVar8) {
        poVar12 = amrex::OutStream();
        amrex::Print::Print((Print *)&mfi,poVar12);
        std::operator<<((ostream *)&mfi.tile_size,
                        "System reached steady-state, stopping simulation.");
        std::endl<char,std::char_traits<char>>((ostream *)&mfi.tile_size);
        amrex::Print::~Print((Print *)&mfi);
      }
    }
    uVar20 = (uint)(local_2b0.m_value < RVar8);
    amrex::ReduceData<double>::~ReduceData(&reduce_data);
  }
  return uVar20;
}

Assistant:

int
NavierStokesBase::steadyState()
{
    if (!get_state_data(State_Type).hasOldData()) {
        return false; // If nothing to compare to, must not yet be steady :)
    }

    MultiFab&   u_old = get_old_data(State_Type);
    MultiFab&   u_new = get_new_data(State_Type);

	//
	// Estimate the maximum change in velocity magnitude since previous
	// iteration
	//
    Real max_change = 0.0;

    ReduceOps<ReduceOpMax> reduce_op;
    ReduceData<Real> reduce_data(reduce_op);
    using ReduceTuple = typename decltype(reduce_data)::Type;

    // Do not OpenMP-fy this loop for now
    // Unclear how to keep OpenMP and GPU implementation
    // from messing with each other
    for (MFIter mfi(u_old,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const auto& bx   = mfi.tilebox();
        const auto& uold = u_old[mfi].array();
        const auto& unew = u_new[mfi].array();

        reduce_op.eval(bx, reduce_data, [uold, unew]
        AMREX_GPU_DEVICE (int i, int j, int k) -> ReduceTuple
        {
            Real uold_mag = 0.0;
            Real unew_mag = 0.0;
            for (int d = 0; d < AMREX_SPACEDIM; ++d)
            {
                uold_mag += uold(i,j,k,d)*uold(i,j,k,d);
                unew_mag += unew(i,j,k,d)*unew(i,j,k,d);
            }

            uold_mag = std::sqrt(uold_mag);
            unew_mag = std::sqrt(unew_mag);

            return std::abs(unew_mag-uold_mag);
        });

        max_change = std::max(amrex::get<0>(reduce_data.value()),
                              max_change);
    }

    ParallelDescriptor::ReduceRealMax(max_change);

	//
	// System is classified as steady if the maximum change is smaller than
	// prescribed tolerance
	//
    bool steady = max_change < steady_tol;

    if (verbose)
    {
        amrex::Print() << "steadyState :: \n" << "LEV = " << level
                       << " MAX_CHANGE = " << max_change << std::endl;

        if (steady)
        {
            amrex::Print()
                << "System reached steady-state, stopping simulation."
                << std::endl;
        }
    }

    return steady;
}